

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CoverageIffClauseSyntax::setChild
          (CoverageIffClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c8f968 + *(int *)(&DAT_00c8f968 + in_RSI * 4)))();
  return;
}

Assistant:

void CoverageIffClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: iff = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}